

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool absl::lts_20240722::Mutex::DecrementSynchSem(Mutex *mu,PerThreadSynch *w,KernelTimeout t)

{
  bool bVar1;
  ThreadIdentity *pTVar2;
  
  pTVar2 = synchronization_internal::GetOrCreateCurrentThreadIdentity();
  if (pTVar2 == (ThreadIdentity *)w) {
    bVar1 = AbslInternalPerThreadSemWait_lts_20240722(t);
    return bVar1;
  }
  __assert_fail("w == Synch_GetPerThread()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x254,
                "static bool absl::Mutex::DecrementSynchSem(Mutex *, PerThreadSynch *, KernelTimeout)"
               );
}

Assistant:

bool Mutex::DecrementSynchSem(Mutex* mu, PerThreadSynch* w, KernelTimeout t) {
  static_cast<void>(mu);  // Prevent unused param warning in non-TSAN builds.
  ABSL_TSAN_MUTEX_PRE_DIVERT(mu, 0);
  assert(w == Synch_GetPerThread());
  static_cast<void>(w);
  bool res = PerThreadSem::Wait(t);
  ABSL_TSAN_MUTEX_POST_DIVERT(mu, 0);
  return res;
}